

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser::addIncludesRecursive(Parser *this,QString *filename,QList<QString> *includes)

{
  bool bVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  uint uVar3;
  int __oflag;
  QStringBuilder<QString_&,_QLatin1Char> *in_RDX;
  Parser *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1Char> QVar4;
  char16_t *str;
  char16_t *str_1;
  QString resolved;
  QFileInfo info2;
  QString rinc;
  QString filename_1;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression includeMacro;
  QString line;
  QTextStream stream;
  QString data;
  QFile input;
  QFileInfo info;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  byte in_stack_fffffffffffffd3e;
  byte in_stack_fffffffffffffd3f;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd40;
  QStringBuilder<QString,_QLatin1Char> *in_stack_fffffffffffffd48;
  QFile *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd60;
  QString *filename_00;
  char16_t *this_00;
  char16_t *this_01;
  undefined8 in_stack_fffffffffffffda8;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions;
  QLatin1Char local_233 [90];
  QLatin1Char local_1d9 [49];
  undefined8 local_1a8;
  QArrayDataPointer<char16_t> local_1a0 [2];
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_130;
  QArrayDataPointer<char16_t> local_120 [2];
  undefined8 local_f0;
  QString *local_e8;
  char local_e0;
  undefined1 local_d1 [25];
  QStringBuilder<QString,_QLatin1Char> local_b8;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  QFile local_78;
  undefined8 local_68;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  filename_00 = in_RDI;
  QFileInfo::QFileInfo((QFileInfo *)in_stack_fffffffffffffd50,&in_stack_fffffffffffffd48->a);
  local_78.super_QFileDevice.super_QIODevice._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa;
  local_78.super_QFileDevice.super_QIODevice.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)0xaaaaaaaaaaaaaaaa
  ;
  QFile::QFile(in_stack_fffffffffffffd50,&in_stack_fffffffffffffd48->a);
  QVar2.i = (Int)operator|((enum_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                           (enum_type)in_stack_fffffffffffffd40);
  uVar3 = QFile::open(&local_78,(char *)(ulong)QVar2.i,__oflag);
  if ((uVar3 & 1) != 0) {
    local_90 = 0xaaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaaaaaaaaaa;
    local_80 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x10fb15);
    local_98 = 0xaaaaaaaaaaaaaaaa;
    QTextStream::QTextStream
              ((QTextStream *)in_stack_fffffffffffffd50,(QIODevice *)in_stack_fffffffffffffd48);
    while( true ) {
      bVar1 = QTextStream::atEnd((QTextStream *)in_stack_fffffffffffffd40);
      matchOptions.i = (Int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_b8.a.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_b8.a.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_b8.a.d.size = -0x5555555555555556;
      in_stack_fffffffffffffd40 = (QArrayDataPointer<char16_t> *)(local_d1 + 1);
      QTextStream::readLine((QTextStream *)in_RDI,(qint64)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd48 = &local_b8;
      QString::trimmed((QString *)
                       CONCAT17(in_stack_fffffffffffffd3f,
                                CONCAT16(in_stack_fffffffffffffd3e,
                                         CONCAT24(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38))));
      QString::~QString((QString *)0x10fbb1);
      in_stack_fffffffffffffd50 = (QFile *)local_d1;
      QLatin1Char::QLatin1Char((QLatin1Char *)in_stack_fffffffffffffd50,'\n');
      QVar4 = ::operator+(&in_stack_fffffffffffffd48->a,(QLatin1Char *)in_stack_fffffffffffffd40);
      local_e8 = QVar4.a;
      local_e0 = (char)QVar4.b.ch;
      local_18 = local_e8;
      local_10 = local_e0;
      operator+=((QString *)in_RSI,in_RDX);
      QString::~QString((QString *)0x10fc26);
    }
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    this_01 = L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]";
    this_00 = L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]";
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_120,(Data *)0x0,L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]",0x25);
    QString::QString((QString *)in_stack_fffffffffffffd40,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffd3f,
                              CONCAT16(in_stack_fffffffffffffd3e,
                                       CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                                      )));
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffd40,
               CONCAT13(in_stack_fffffffffffffd3f,
                        CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)));
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)in_stack_fffffffffffffd50,&in_stack_fffffffffffffd48->a,
               (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
               SUB84((ulong)in_RDI >> 0x20,0));
    QString::~QString((QString *)0x10fcc5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd40);
    local_130 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffffd40,
               CONCAT13(in_stack_fffffffffffffd3f,
                        CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)));
    QRegularExpression::globalMatch
              ((QRegularExpression *)this_01,(QString *)this_00,(qsizetype)filename_00,
               (MatchType)((ulong)in_RSI >> 0x20),(MatchOptions)matchOptions.i);
    while (bVar1 = QRegularExpressionMatchIterator::hasNext
                             ((QRegularExpressionMatchIterator *)0x10fd29), bVar1) {
      local_140 = 0xaaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)in_RDI);
      local_158 = 0xaaaaaaaaaaaaaaaa;
      local_150 = 0xaaaaaaaaaaaaaaaa;
      local_148 = 0xaaaaaaaaaaaaaaaa;
      QRegularExpressionMatch::captured
                ((QRegularExpressionMatch *)in_stack_fffffffffffffd50,
                 (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      local_170 = 0xaaaaaaaaaaaaaaaa;
      local_168 = 0xaaaaaaaaaaaaaaaa;
      local_160 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_fffffffffffffd40,
                       (QString *)
                       CONCAT17(in_stack_fffffffffffffd3f,
                                CONCAT16(in_stack_fffffffffffffd3e,
                                         CONCAT24(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38))));
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_1a0,(Data *)0x0,L"../",3);
      QString::QString((QString *)in_stack_fffffffffffffd40,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffd3f,
                                CONCAT16(in_stack_fffffffffffffd3e,
                                         CONCAT24(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38))));
      in_stack_fffffffffffffd3f =
           QString::startsWith(&in_stack_fffffffffffffd48->a,(QString *)in_stack_fffffffffffffd40,
                               CONCAT13(in_stack_fffffffffffffd3f,
                                        CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c
                                                )));
      QString::~QString((QString *)0x10fe5d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd40);
      if ((in_stack_fffffffffffffd3f & 1) == 0) {
LAB_0010fff3:
        QFileInfo::QFileInfo((QFileInfo *)in_stack_fffffffffffffd50,&in_stack_fffffffffffffd48->a);
        QFileInfo::baseName((QFileInfo *)CONCAT44(QVar2.i,in_stack_fffffffffffffd60));
        QLatin1Char::QLatin1Char(local_233,'q');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffffd40,
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd48 >> 0x38));
        in_stack_fffffffffffffd3e =
             QString::startsWith(&in_stack_fffffffffffffd48->a,
                                 (QChar)(char16_t)((ulong)in_RDI >> 0x30),
                                 (CaseSensitivity)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        QString::~QString((QString *)0x11006c);
        QFileInfo::~QFileInfo((QFileInfo *)0x110079);
        if ((in_stack_fffffffffffffd3e & 1) != 0) {
          resolveInclude((Parser *)this_00,filename_00);
          bVar1 = QString::isEmpty((QString *)0x1100d1);
          if ((!bVar1) &&
             (bVar1 = QListSpecialMethods<QString>::contains
                                ((QListSpecialMethods<QString> *)in_stack_fffffffffffffd48,
                                 (QString *)in_stack_fffffffffffffd40,
                                 CONCAT13(in_stack_fffffffffffffd3f,
                                          CONCAT12(in_stack_fffffffffffffd3e,
                                                   in_stack_fffffffffffffd3c))), !bVar1)) {
            QList<QString>::push_back
                      ((QList<QString> *)in_stack_fffffffffffffd40,
                       (parameter_type)
                       CONCAT17(in_stack_fffffffffffffd3f,
                                CONCAT16(in_stack_fffffffffffffd3e,
                                         CONCAT24(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38))));
            addIncludesRecursive
                      (in_RSI,(QString *)in_RDX,
                       (QList<QString> *)CONCAT44(QVar2.i,in_stack_fffffffffffffd60));
          }
          QString::~QString((QString *)0x11011a);
        }
        in_stack_fffffffffffffd60 = 0;
      }
      else {
        local_1a8 = 0xaaaaaaaaaaaaaaaa;
        QFileInfo::absolutePath((QFileInfo *)in_RDI);
        QLatin1Char::QLatin1Char(local_1d9,'/');
        ::operator+(&in_stack_fffffffffffffd48->a,(QLatin1Char *)in_stack_fffffffffffffd40);
        ::operator+(in_stack_fffffffffffffd48,(QString *)in_stack_fffffffffffffd40);
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)
                   CONCAT17(in_stack_fffffffffffffd3f,
                            CONCAT16(in_stack_fffffffffffffd3e,
                                     CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)))
                  );
        QFileInfo::QFileInfo((QFileInfo *)in_stack_fffffffffffffd50,&in_stack_fffffffffffffd48->a);
        QString::~QString((QString *)0x10ff1e);
        QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x10ff2b);
        QStringBuilder<QString,_QLatin1Char>::~QStringBuilder
                  ((QStringBuilder<QString,_QLatin1Char> *)0x10ff38);
        QString::~QString((QString *)0x10ff45);
        bVar1 = QFileInfo::exists((QFileInfo *)in_RDX);
        if (bVar1) {
          QFileInfo::absoluteFilePath((QFileInfo *)in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd40,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffd3f,
                                      CONCAT16(in_stack_fffffffffffffd3e,
                                               CONCAT24(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38))));
          QString::~QString((QString *)0x10ff97);
          QFileInfo::fileName((QFileInfo *)in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd40,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffd3f,
                                      CONCAT16(in_stack_fffffffffffffd3e,
                                               CONCAT24(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38))));
          QString::~QString((QString *)0x10ffce);
          in_stack_fffffffffffffd60 = 0;
        }
        else {
          in_stack_fffffffffffffd60 = 4;
        }
        QFileInfo::~QFileInfo((QFileInfo *)0x10ffe3);
        if (in_stack_fffffffffffffd60 == 0) goto LAB_0010fff3;
      }
      QString::~QString((QString *)0x11012f);
      QString::~QString((QString *)0x11013c);
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x110149);
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)0x11016a);
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x110177);
    QTextStream::~QTextStream((QTextStream *)in_stack_fffffffffffffd40);
    QString::~QString((QString *)0x110191);
  }
  QFile::~QFile((QFile *)0x1101a6);
  QFileInfo::~QFileInfo((QFileInfo *)0x1101b3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Parser::addIncludesRecursive(const QString &filename, QList<QString> &includes)
{
    QFileInfo info(filename);
    DEBUGPRINTF(printf("check include: %s\n", qPrintable(filename)));
    QFile input(filename);
    if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
        DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                            qPrintable(filename), qPrintable(input.errorString())));
        return;
    }
    QString data;
    QTextStream stream(&input);
    while (!stream.atEnd()) {
        QString line = stream.readLine().trimmed();
        data += line + QLatin1Char(QLatin1Char('\n'));
    }

    QRegularExpression includeMacro(QStringLiteral("#include [\"<]([A-Za-z0-9_./-]*.h)[\">]"));
    QRegularExpressionMatchIterator i = includeMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString filename = match.captured(1);

        QString rinc = filename;
        if (filename.startsWith(QStringLiteral("../"))) {
            QFileInfo info2(info.absolutePath() + QLatin1Char('/') + filename);
            if (!info2.exists()) {
                DEBUGPRINTF(printf("unable to find %s\n", qPrintable(filename)));
                continue;
            }
            rinc = info2.absoluteFilePath();
            filename = info2.fileName();
        }
        // only search possible qt headers
        if (QFileInfo(filename).baseName().startsWith(QLatin1Char('q'), Qt::CaseInsensitive)) {
            QString resolved = resolveInclude(rinc);
            if (!resolved.isEmpty() && !includes.contains(resolved)) {
                includes.push_back(resolved);
                addIncludesRecursive(resolved, includes);
            }
        }
    }
}